

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_run.c
# Opt level: O1

fork_status srunner_fork_status(SRunner *sr)

{
  int iVar1;
  fork_status fVar2;
  char *__s1;
  
  if (sr->fstat != CK_FORK_GETENV) {
    return sr->fstat;
  }
  __s1 = getenv("CK_FORK");
  if (__s1 == (char *)0x0) {
    fVar2 = CK_FORK;
  }
  else {
    iVar1 = strcmp(__s1,"no");
    fVar2 = (iVar1 == 0) + CK_FORK;
  }
  return fVar2;
}

Assistant:

enum fork_status srunner_fork_status(SRunner * sr)
{
    if(sr->fstat == CK_FORK_GETENV)
    {
        char *env = getenv("CK_FORK");

        if(env == NULL)
#if defined(HAVE_FORK) && HAVE_FORK==1
            return CK_FORK;
#else
            return CK_NOFORK;
#endif
        if(strcmp(env, "no") == 0)
            return CK_NOFORK;
#if defined(HAVE_FORK) && HAVE_FORK==1
        return CK_FORK;
#else /* HAVE_FORK */
        /* Ignoring, as Check is not compiled with fork support. */
        return CK_NOFORK;
#endif /* HAVE_FORK */
    }
    return sr->fstat;
}